

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitBdd.c
# Opt level: O0

DdNode * Kit_SopToBdd(DdManager *dd,Kit_Sop_t *cSop,int nVars)

{
  int iVar1;
  uint uVar2;
  DdNode *pDVar3;
  bool bVar4;
  int local_50;
  int local_4c;
  int v;
  int i;
  int Value;
  uint uCube;
  DdNode *bVar;
  DdNode *bTemp;
  DdNode *bCube;
  DdNode *bSum;
  int nVars_local;
  Kit_Sop_t *cSop_local;
  DdManager *dd_local;
  
  if (0xf < nVars) {
    __assert_fail("nVars < 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitBdd.c"
                  ,0x38,"DdNode *Kit_SopToBdd(DdManager *, Kit_Sop_t *, int)");
  }
  bCube = Cudd_ReadLogicZero(dd);
  Cudd_Ref(bCube);
  local_4c = 0;
  do {
    iVar1 = Kit_SopCubeNum(cSop);
    bVar4 = false;
    if (local_4c < iVar1) {
      i = Kit_SopCube(cSop,local_4c);
      bVar4 = i != 0;
    }
    if (!bVar4) {
      Cudd_Deref(bCube);
      return bCube;
    }
    bTemp = Cudd_ReadOne(dd);
    Cudd_Ref(bTemp);
    for (local_50 = 0; local_50 < nVars; local_50 = local_50 + 1) {
      uVar2 = (uint)i >> ((byte)(local_50 << 1) & 0x1f) & 3;
      if (uVar2 == 1) {
        _Value = Cudd_bddIthVar(dd,local_50);
        _Value = (DdNode *)((ulong)_Value ^ 1);
LAB_006e6a39:
        pDVar3 = Cudd_bddAnd(dd,bTemp,_Value);
        Cudd_Ref(pDVar3);
        Cudd_RecursiveDeref(dd,bTemp);
        bTemp = pDVar3;
      }
      else if (uVar2 == 2) {
        _Value = Cudd_bddIthVar(dd,local_50);
        goto LAB_006e6a39;
      }
    }
    pDVar3 = Cudd_bddOr(dd,bCube,bTemp);
    Cudd_Ref(pDVar3);
    Cudd_RecursiveDeref(dd,bCube);
    Cudd_RecursiveDeref(dd,bTemp);
    local_4c = local_4c + 1;
    bCube = pDVar3;
  } while( true );
}

Assistant:

DdNode * Kit_SopToBdd( DdManager * dd, Kit_Sop_t * cSop, int nVars )
{
    DdNode * bSum, * bCube, * bTemp, * bVar;
    unsigned uCube;
    int Value, i, v;
    assert( nVars < 16 );
    // start the cover
    bSum = Cudd_ReadLogicZero(dd);   Cudd_Ref( bSum );
   // check the logic function of the node
    Kit_SopForEachCube( cSop, uCube, i )
    {
        bCube = Cudd_ReadOne(dd);   Cudd_Ref( bCube );
        for ( v = 0; v < nVars; v++ )
        {
            Value = ((uCube >> 2*v) & 3);
            if ( Value == 1 )
                bVar = Cudd_Not( Cudd_bddIthVar( dd, v ) );
            else if ( Value == 2 )
                bVar = Cudd_bddIthVar( dd, v );
            else
                continue;
            bCube  = Cudd_bddAnd( dd, bTemp = bCube, bVar );   Cudd_Ref( bCube );
            Cudd_RecursiveDeref( dd, bTemp );
        }
        bSum = Cudd_bddOr( dd, bTemp = bSum, bCube );   
        Cudd_Ref( bSum );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bCube );
    }
    // complement the result if necessary
    Cudd_Deref( bSum );
    return bSum;
}